

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KisteTemplate.h
# Opt level: O3

void __thiscall
kiste::KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::render_header
          (KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this)

{
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,"// generated by kiste2cpp\n#pragma once\n",0x27);
  if (this->data->_report_exceptions == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->_serialize->_os,"#include <exception>\n",0x15);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,"#include <kiste/raw_type.h>\n#include <kiste/terminal.h>\n\n",
             0x39);
  if (this->data->_line_directives == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"#line 1 \"",9);
    cpp::
    escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (this->_serialize,&this->data->_filename);
    std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"\"\n",2);
    return;
  }
  return;
}

Assistant:

void render_header()
    {
    _serialize.text("// generated by kiste2cpp\n"
                    "#pragma once\n");
      if (data._report_exceptions)
      {
      _serialize.text("#include <exception>\n");
      }
    _serialize.text("#include <kiste/raw_type.h>\n"
                    "#include <kiste/terminal.h>\n"
                    "\n");
      if (data._line_directives)
      {
      _serialize.text("#line 1 \"");_serialize.escape(data._filename);_serialize.text("\"\n");
      }
    }